

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O1

tuple<int,_int,_int>
libtorrent::merkle_find_known_subtree
          (span<const_libtorrent::digest32<256L>_> tree,int block_index,int num_valid_leafs)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint extraout_EDX;
  _Head_base<0UL,_int,_false> _Var13;
  int in_register_00000014;
  uint uVar14;
  long lVar15;
  uint uVar16;
  _Tuple_impl<1UL,_int,_int> _Var17;
  int in_R8D;
  long lVar18;
  digest32<256L> *this;
  uint uVar19;
  uint uVar20;
  tuple<int,_int,_int> tVar21;
  int iVar7;
  
  lVar15 = tree.m_len;
  _Var17 = (_Tuple_impl<1UL,_int,_int>)tree.m_ptr;
  iVar7 = (int)((ulong)(CONCAT44(in_register_00000014,block_index) -
                       ((long)in_register_00000014 >> 0x1f)) >> 1);
  uVar6 = iVar7 + num_valid_leafs;
  uVar6 = (-(uint)((uVar6 & 1) == 0) | 1) + uVar6;
  uVar19 = *(uint *)_Var17;
  uVar12 = *(uint *)((long)_Var17 + 4);
  uVar16 = *(uint *)((long)_Var17 + 8);
  uVar14 = 1;
  uVar10 = num_valid_leafs;
  do {
    uVar8 = -uVar14;
    if ((num_valid_leafs & 1U) == 0) {
      uVar8 = uVar14;
    }
    uVar20 = in_R8D - (uVar8 + uVar10);
    if ((int)uVar14 <= (int)uVar20) {
      uVar20 = uVar14;
    }
    bVar5 = 0 < (int)uVar20;
    if ((int)uVar20 < 1) {
      cVar9 = '\x05';
      uVar8 = uVar19;
      _Var13._M_head_impl = uVar12;
      uVar2 = uVar16;
      uVar3 = uVar12;
    }
    else {
      lVar18 = (long)(int)(uVar8 + uVar10 + iVar7) * 0x20;
      bVar4 = digest32<256L>::is_all_zeros((digest32<256L> *)(lVar15 + lVar18));
      cVar9 = '\x01';
      uVar8 = uVar6;
      _Var13._M_head_impl = uVar6;
      uVar2 = uVar10;
      uVar3 = uVar14;
      if (!bVar4) {
        this = (digest32<256L> *)(lVar18 + lVar15 + 0x20);
        uVar1 = 1;
        do {
          uVar11 = uVar1;
          if (uVar20 == uVar11) {
            cVar9 = '\x05';
            goto LAB_002294a9;
          }
          bVar5 = digest32<256L>::is_all_zeros(this);
          this = this + 1;
          uVar1 = uVar11 + 1;
        } while (!bVar5);
        cVar9 = '\x01';
        uVar19 = uVar6;
        uVar12 = uVar14;
        uVar16 = uVar10;
LAB_002294a9:
        bVar5 = uVar11 < uVar20;
        uVar8 = uVar19;
        _Var13._M_head_impl = uVar12;
        uVar2 = uVar16;
        uVar3 = uVar12;
      }
    }
    uVar12 = uVar3;
    uVar16 = uVar2;
    uVar19 = uVar8;
    if (!bVar5) {
      uVar10 = uVar10 - (-(num_valid_leafs & 1U) & uVar14);
      uVar14 = uVar14 * 2;
      uVar6 = (int)((uVar6 - ((int)(uVar6 - 1) >> 0x1f)) + -1) >> 1;
      bVar5 = digest32<256L>::is_all_zeros((digest32<256L> *)((long)(int)uVar6 * 0x20 + lVar15));
      cVar9 = !bVar5 * '\x02';
      _Var13._M_head_impl = extraout_EDX;
    }
    if (cVar9 != '\0') {
      if (cVar9 == '\x02') {
        *(uint *)_Var17 = uVar6;
        *(uint *)((long)_Var17 + 4) = uVar14;
        *(uint *)((long)_Var17 + 8) = uVar10;
      }
      else {
        *(uint *)((long)_Var17 + 4) = uVar12;
        *(uint *)((long)_Var17 + 8) = uVar16;
        *(uint *)_Var17 = uVar19;
      }
      tVar21.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
           _Var13._M_head_impl;
      tVar21.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> = _Var17;
      return (tuple<int,_int,_int>)tVar21.super__Tuple_impl<0UL,_int,_int,_int>;
    }
    num_valid_leafs = num_valid_leafs >> 1;
  } while( true );
}

Assistant:

std::tuple<int, int, int> merkle_find_known_subtree(span<sha256_hash const> const tree
		, int const block_index, int const num_valid_leafs)
	{
		// find the largest block of leafs from a single subtree we know the hashes of
		int leafs_start = block_index;
		int leafs_size = 1;
		int const first_leaf = int(tree.size() / 2);
		int root_index = merkle_get_sibling(first_leaf + block_index);
		for (int i = block_index;; i >>= 1)
		{
			int const first_check_index = leafs_start + ((i & 1) ? -leafs_size : leafs_size);
			for (int j = 0; j < std::min(leafs_size, num_valid_leafs - first_check_index); ++j)
			{
				if (tree[first_leaf + first_check_index + j].is_all_zeros())
					return std::make_tuple(leafs_start, leafs_size, root_index);
			}
			if (i & 1) leafs_start -= leafs_size;
			leafs_size *= 2;
			root_index = merkle_get_parent(root_index);
			// if an inner node is known then its parent must be known too
			// so if the root is known the next sibling subtree should already
			// be computed if all of its leafs have valid hashes
			if (!tree[root_index].is_all_zeros()) break;
			TORRENT_ASSERT(root_index != 0);
			TORRENT_ASSERT(leafs_start >= 0);
			TORRENT_ASSERT(leafs_size <= merkle_num_leafs(num_valid_leafs));
		}

		TORRENT_ASSERT(leafs_start >= 0);
		TORRENT_ASSERT(leafs_start < merkle_num_leafs(num_valid_leafs));
		TORRENT_ASSERT(leafs_start + leafs_size > block_index);

		return std::make_tuple(leafs_start, leafs_size, root_index);
	}